

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void raiseSeparatorWidget(QWidget *separatorWidget)

{
  QWidget *this;
  long lVar1;
  QLayout *pQVar2;
  long lVar3;
  long lVar4;
  int __sig;
  long lVar5;
  long in_FS_OFFSET;
  QList<QToolBar_*> list;
  QArrayData *local_58;
  long lStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  __sig = 0;
  qt_qFindChildren_helper
            (*(undefined8 *)(*(long *)&separatorWidget->field_0x8 + 0x10),0,0,
             &QToolBar::staticMetaObject,&local_58,0);
  lVar1 = lStack_50;
  if (local_48 != 0) {
    lVar5 = local_48 << 3;
    lVar4 = 0;
    do {
      this = *(QWidget **)(lVar1 + lVar4);
      pQVar2 = QWidget::layout(this);
      __sig = (int)pQVar2;
      lVar3 = QMetaObject::cast((QObject *)&QToolBarLayout::staticMetaObject);
      if ((lVar3 != 0) && (*(char *)(lVar3 + 0x1c) == '\x01')) {
        QWidget::stackUnder(separatorWidget,this);
        goto LAB_003f48b9;
      }
      lVar4 = lVar4 + 8;
    } while (lVar5 != lVar4);
  }
  QWidget::raise(separatorWidget,__sig);
LAB_003f48b9:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void raiseSeparatorWidget(QWidget *separatorWidget)
{
    Q_ASSERT(separatorWidget);

#if QT_CONFIG(toolbar)
    // Raise the separator widget, but make sure it doesn't go above
    // an expanded toolbar, as that would break mouse event hit testing.
    Q_ASSERT(separatorWidget->parent());
    const auto toolBars = separatorWidget->parent()->findChildren<QToolBar*>(Qt::FindDirectChildrenOnly);
    for (auto *toolBar : toolBars) {
        if (auto *toolBarLayout = qobject_cast<QToolBarLayout*>(toolBar->layout())) {
            if (toolBarLayout->expanded) {
                separatorWidget->stackUnder(toolBar);
                return;
            }
        }
    }
#endif

    separatorWidget->raise();
}